

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderTextureImageSamplesTests.cpp
# Opt level: O3

void __thiscall
glcts::ShaderTextureImageSamplesGLSLExtensionEnableTest::
ShaderTextureImageSamplesGLSLExtensionEnableTest
          (ShaderTextureImageSamplesGLSLExtensionEnableTest *this,Context *context)

{
  tcu::TestCase::TestCase
            ((TestCase *)this,context->m_testCtx,"glsl_extension_enable",
             "Verifies a shader with \"#extension GL_ARB_shader_texture_image_samples : enable\" line defines a corresponding pre-processor macro."
            );
  (this->super_ShaderTextureImageSamplesTestBase).super_TestCase.m_context = context;
  (this->super_ShaderTextureImageSamplesTestBase).m_internalformat_n_samples_count = 0;
  (this->super_ShaderTextureImageSamplesTestBase).m_internalformat_n_samples_data = (GLint *)0x0;
  (this->super_ShaderTextureImageSamplesTestBase).m_bo_id = 0;
  (this->super_ShaderTextureImageSamplesTestBase).m_cs_id = 0;
  (this->super_ShaderTextureImageSamplesTestBase).m_po_id = 0;
  (this->super_ShaderTextureImageSamplesTestBase).m_to_id = 0;
  (this->super_ShaderTextureImageSamplesTestBase).m_to_depth = 3;
  (this->super_ShaderTextureImageSamplesTestBase).m_to_height = 4;
  (this->super_ShaderTextureImageSamplesTestBase).m_to_width = 8;
  (this->super_ShaderTextureImageSamplesTestBase).super_TestCase.super_TestCase.super_TestNode.
  _vptr_TestNode = (_func_int **)&PTR__TestCase_020ec410;
  return;
}

Assistant:

ShaderTextureImageSamplesGLSLExtensionEnableTest::ShaderTextureImageSamplesGLSLExtensionEnableTest(
	deqp::Context& context)
	: ShaderTextureImageSamplesTestBase(
		  context, "glsl_extension_enable",
		  "Verifies a shader with \"#extension GL_ARB_shader_texture_image_samples : enable\" "
		  "line defines a corresponding pre-processor macro.")
{
	/* Left blank on purpose */
}